

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

_Bool roaring64_iterator_advance(roaring64_iterator_t *it)

{
  _Bool _Var1;
  roaring_container_iterator_t rVar2;
  art_val_t *paVar3;
  ulong uVar4;
  ulong uVar5;
  uint16_t low16;
  uint16_t low16_1;
  ushort local_a2;
  art_iterator_t local_a0;
  
  paVar3 = (it->art_it).value;
  if (paVar3 == (art_val_t *)0x0) {
    if (it->saturated_forward == true) {
      it->has_value = false;
    }
    else {
      art_init_iterator(&local_a0,&it->parent->art,true);
      memcpy(&it->art_it,&local_a0,0x88);
      paVar3 = (it->art_it).value;
      it->has_value = paVar3 != (art_val_t *)0x0;
      if (paVar3 != (art_val_t *)0x0) {
        uVar4 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
        uVar5 = (ulong)*(uint6 *)(it->art_it).key;
        it->high48 = (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                     (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                     (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
        goto LAB_00109413;
      }
      it->saturated_forward = true;
    }
LAB_00109463:
    _Var1 = false;
  }
  else {
    local_a2 = (ushort)it->value;
    _Var1 = container_iterator_next
                      (*(container_t **)(paVar3[1].key + 2),paVar3[1].key[0],&it->container_it,
                       &local_a2);
    local_a0.key._0_2_ = local_a2;
    if (!_Var1) {
      _Var1 = art_iterator_next(&it->art_it);
      if (!_Var1) {
        it->has_value = false;
        it->saturated_forward = true;
        goto LAB_00109463;
      }
      uVar4 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
      uVar5 = (ulong)*(uint6 *)(it->art_it).key;
      it->high48 = (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                   (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28
                   | uVar5 << 0x38;
      paVar3 = (it->art_it).value;
LAB_00109413:
      local_a0.key[0] = '\0';
      local_a0.key[1] = '\0';
      rVar2 = container_init_iterator
                        (*(container_t **)(paVar3[1].key + 2),paVar3[1].key[0],(uint16_t *)&local_a0
                        );
      (it->container_it).index = rVar2.index;
    }
    it->value = (ulong)(ushort)local_a0.key._0_2_ | it->high48;
    it->has_value = true;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool roaring64_iterator_advance(roaring64_iterator_t *it) {
    if (it->art_it.value == NULL) {
        if (it->saturated_forward) {
            return (it->has_value = false);
        }
        roaring64_iterator_init_at(it->parent, it, /*first=*/true);
        return it->has_value;
    }
    leaf_t *leaf = (leaf_t *)it->art_it.value;
    uint16_t low16 = (uint16_t)it->value;
    if (container_iterator_next(leaf->container, leaf->typecode,
                                &it->container_it, &low16)) {
        it->value = it->high48 | low16;
        return (it->has_value = true);
    }
    if (art_iterator_next(&it->art_it)) {
        return roaring64_iterator_init_at_leaf_first(it);
    }
    it->saturated_forward = true;
    return (it->has_value = false);
}